

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

string_t duckdb::TernaryLambdaWrapper::
         Operation<duckdb::RegexReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__1,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_16_2_50904408 fun,string_t a,string_t b,string_t c,ValidityMask *mask
                   ,idx_t idx)

{
  InvalidInputException *this;
  anon_union_16_2_67f50693_for_value aVar1;
  undefined8 local_118;
  char *pcStack_110;
  string sstring;
  anon_union_16_2_67f50693_for_value local_e0;
  StringPiece local_d0;
  undefined8 local_c0;
  pointer local_b8;
  RE2 re;
  
  local_b8 = b.value._8_8_;
  local_c0 = b.value._0_8_;
  local_e0.pointer.ptr = (char *)a.value._8_8_;
  local_e0._0_8_ = a.value._0_8_;
  local_118 = c.value._0_8_;
  pcStack_110 = c.value.pointer.ptr;
  sstring._M_dataplus._M_p = local_b8;
  if (b.value._0_4_ < 0xd) {
    sstring._M_dataplus._M_p = (pointer)((long)&local_c0 + 4);
  }
  sstring._M_string_length = (size_type)b.value._0_4_;
  duckdb_re2::RE2::RE2(&re,(StringPiece *)&sstring,&((fun.info)->super_RegexpBaseBindData).options);
  if ((re._68_4_ & 0x1fffffff) == 0) {
    string_t::GetString_abi_cxx11_(&sstring,(string_t *)&local_e0.pointer);
    local_d0.data_ = (char *)((long)&local_118 + 4);
    if (((fun.info)->super_RegexpBaseBindData).field_0x41 == '\x01') {
      local_d0.size_ = local_118 & 0xffffffff;
      if (0xc < local_d0.size_) {
        local_d0.data_ = pcStack_110;
      }
      duckdb_re2::RE2::GlobalReplace(&sstring,&re,&local_d0);
    }
    else {
      local_d0.size_ = local_118 & 0xffffffff;
      if (0xc < local_d0.size_) {
        local_d0.data_ = pcStack_110;
      }
      duckdb_re2::RE2::Replace(&sstring,&re,&local_d0);
    }
    aVar1.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(fun.result,&sstring);
    ::std::__cxx11::string::~string((string *)&sstring);
    duckdb_re2::RE2::~RE2(&re);
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,(string *)re.error_);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUN fun, A_TYPE a, B_TYPE b, C_TYPE c, ValidityMask &mask, idx_t idx) {
		return fun(a, b, c);
	}